

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<false> * __thiscall
LabelObjectState<false>::Float(LabelObjectState<false> *this,Context<false> *ctx,float v)

{
  char *pcVar1;
  int iVar2;
  stringstream *psVar3;
  size_t sVar4;
  
  pcVar1 = ctx->key;
  iVar2 = strcasecmp(pcVar1,"Label");
  if (iVar2 == 0) {
    (ctx->ex->l).simple.label = v;
  }
  else {
    iVar2 = strcasecmp(pcVar1,"Initial");
    if (iVar2 == 0) {
      (ctx->ex->l).simple.initial = v;
    }
    else {
      iVar2 = strcasecmp(pcVar1,"Weight");
      if (iVar2 != 0) {
        iVar2 = strcasecmp(pcVar1,"Action");
        if (iVar2 == 0) {
          (this->cb_label).action = (uint32_t)(long)v;
        }
        else {
          iVar2 = strcasecmp(pcVar1,"Cost");
          if (iVar2 == 0) {
            (this->cb_label).cost = v;
          }
          else {
            iVar2 = strcasecmp(pcVar1,"Probability");
            if (iVar2 != 0) {
              psVar3 = Context<false>::error_abi_cxx11_(ctx);
              psVar3 = psVar3 + 0x10;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar3,"Unsupported label property: \'",0x1d);
              pcVar1 = ctx->key;
              if (pcVar1 == (char *)0x0) {
                std::ios::clear((int)psVar3 + (int)*(undefined8 *)(*(long *)psVar3 + -0x18));
              }
              else {
                sVar4 = strlen(pcVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar3,pcVar1,sVar4);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar3,"\' len: ",7);
              std::ostream::_M_insert<unsigned_long>((ulong)psVar3);
              return (BaseState<false> *)0x0;
            }
            (this->cb_label).probability = v;
          }
        }
        this->found_cb = true;
        return &this->super_BaseState<false>;
      }
      (ctx->ex->l).simple.weight = v;
    }
  }
  this->found = true;
  return &this->super_BaseState<false>;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float v)
  {
    // simple
    if (!_stricmp(ctx.key, "Label"))
    {
      ctx.ex->l.simple.label = v;
      found = true;
    }
    else if (!_stricmp(ctx.key, "Initial"))
    {
      ctx.ex->l.simple.initial = v;
      found = true;
    }
    else if (!_stricmp(ctx.key, "Weight"))
    {
      ctx.ex->l.simple.weight = v;
      found = true;
    }
    // CB
    else if (!_stricmp(ctx.key, "Action"))
    {
      cb_label.action = (uint32_t)v;
      found_cb = true;
    }
    else if (!_stricmp(ctx.key, "Cost"))
    {
      cb_label.cost = v;
      found_cb = true;
    }
    else if (!_stricmp(ctx.key, "Probability"))
    {
      cb_label.probability = v;
      found_cb = true;
    }
    else
    {
      ctx.error() << "Unsupported label property: '" << ctx.key << "' len: " << ctx.key_length;
      return nullptr;
    }

    return this;
  }